

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracker_list.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::tracker_list::replace
          (tracker_list *this,
          vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
          *aes)

{
  byte *pbVar1;
  header_holder_type *phVar2;
  pointer paVar3;
  node_ptr plVar4;
  uint uVar5;
  element_type *chunk;
  ulong uVar6;
  ulong uVar7;
  list_impl<boost::intrusive::mhtraits<libtorrent::aux::announce_entry,boost::intrusive::list_member_hook<>,&libtorrent::aux::announce_entry::list_hook>,unsigned_long,true,void>
  *plVar8;
  trackers_t *init;
  __off64_t *in_R8;
  size_t in_R9;
  announce_entry *ae;
  pointer a0;
  uint uVar9;
  long *plVar10;
  pair<std::__detail::_Node_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_libtorrent::aux::announce_entry_*>,_false,_true>,_bool>
  pVar11;
  uint in_stack_fffffffffffff988;
  node_ptr local_660;
  node_ptr local_658;
  list_impl<boost::intrusive::mhtraits<libtorrent::aux::announce_entry,_boost::intrusive::list_member_hook<>,_&libtorrent::aux::announce_entry::list_hook>,_unsigned_long,_true,_void>
  carry;
  array_initializer<boost::intrusive::list_impl<boost::intrusive::mhtraits<libtorrent::aux::announce_entry,_boost::intrusive::list_member_hook<>,_&libtorrent::aux::announce_entry::list_hook>,_unsigned_long,_true,_void>,_64UL>
  counter;
  
  init = &this->m_trackers;
  boost::intrusive::
  list_impl<boost::intrusive::mhtraits<libtorrent::aux::announce_entry,_boost::intrusive::list_member_hook<>,_&libtorrent::aux::announce_entry::list_hook>,_unsigned_long,_true,_void>
  ::clear_and_dispose<boost::intrusive::detail::null_disposer>();
  ::std::
  _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_libtorrent::aux::announce_entry_*>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_libtorrent::aux::announce_entry_*>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::clear(&(this->m_url_index)._M_h);
  boost::object_pool<libtorrent::aux::announce_entry,_boost::default_user_allocator_new_delete>::
  ~object_pool(&this->m_storage);
  (this->m_storage).super_pool<boost::default_user_allocator_new_delete>.list.sz = 0;
  (this->m_storage).super_pool<boost::default_user_allocator_new_delete>.
  super_simple_segregated_storage<unsigned_long>.first = (void *)0x0;
  (this->m_storage).super_pool<boost::default_user_allocator_new_delete>.list.ptr = (char *)0x0;
  (this->m_storage).super_pool<boost::default_user_allocator_new_delete>.requested_size = 0x70;
  (this->m_storage).super_pool<boost::default_user_allocator_new_delete>.next_size = 0x20;
  (this->m_storage).super_pool<boost::default_user_allocator_new_delete>.start_size = 0x20;
  (this->m_storage).super_pool<boost::default_user_allocator_new_delete>.max_size = 0;
  paVar3 = (aes->
           super__Vector_base<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (a0 = (aes->
            super__Vector_base<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
            )._M_impl.super__Vector_impl_data._M_start; a0 != paVar3; a0 = a0 + 1) {
    if ((a0->url)._M_string_length != 0) {
      chunk = boost::
              object_pool<libtorrent::aux::announce_entry,_boost::default_user_allocator_new_delete>
              ::construct<libtorrent::v1_2::announce_entry>(&this->m_storage,a0);
      counter.rawbuf[0]._8_8_ = (chunk->url)._M_dataplus._M_p;
      counter.rawbuf[0].long_ = (chunk->url)._M_string_length;
      counter.rawbuf[1].void_ptr_ = chunk;
      pVar11 = ::std::
               _Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,libtorrent::aux::announce_entry*>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,libtorrent::aux::announce_entry*>>,std::__detail::_Select1st,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
               ::
               _M_emplace<std::pair<std::basic_string_view<char,std::char_traits<char>>,libtorrent::aux::announce_entry*>>
                         ((_Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,libtorrent::aux::announce_entry*>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,libtorrent::aux::announce_entry*>>,std::__detail::_Select1st,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                           *)&this->m_url_index,&counter);
      if (((undefined1  [16])pVar11 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        boost::
        object_pool<libtorrent::aux::announce_entry,_boost::default_user_allocator_new_delete>::
        destroy(&this->m_storage,chunk);
        pbVar1 = (byte *)(*(long *)((long)pVar11.first.
                                          super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_libtorrent::aux::announce_entry_*>,_true>
                                          ._M_cur.
                                          super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_libtorrent::aux::announce_entry_*>,_true>
                                   + 0x18) + 0x6e);
        *pbVar1 = *pbVar1 | a0->field_0x5a & 0xf;
      }
      else {
        boost::intrusive::
        list_impl<boost::intrusive::mhtraits<libtorrent::aux::announce_entry,_boost::intrusive::list_member_hook<>,_&libtorrent::aux::announce_entry::list_hook>,_unsigned_long,_true,_void>
        ::push_back(&init->super_type,chunk);
      }
    }
  }
  if ((this->m_trackers).super_type.data_.root_plus_size_.m_header.super_node.next_ !=
      (this->m_trackers).super_type.data_.root_plus_size_.m_header.super_node.prev_) {
    carry.data_.root_plus_size_.m_header.super_node.next_ =
         &carry.data_.root_plus_size_.m_header.super_node;
    carry.data_.root_plus_size_.super_size_traits.size_ = 0;
    carry.data_.root_plus_size_.m_header.super_node.prev_ =
         carry.data_.root_plus_size_.m_header.super_node.next_;
    boost::intrusive::detail::
    array_initializer<boost::intrusive::list_impl<boost::intrusive::mhtraits<libtorrent::aux::announce_entry,boost::intrusive::list_member_hook<>,&libtorrent::aux::announce_entry::list_hook>,unsigned_long,true,void>,64ul>
    ::
    array_initializer<boost::intrusive::mhtraits<libtorrent::aux::announce_entry,boost::intrusive::list_member_hook<>,&libtorrent::aux::announce_entry::list_hook>>
              (&counter,(mhtraits<libtorrent::aux::announce_entry,_boost::intrusive::list_member_hook<>,_&libtorrent::aux::announce_entry::list_hook>
                         *)init);
    phVar2 = &(this->m_trackers).super_type.data_.root_plus_size_.m_header;
    uVar5 = 0;
    while( true ) {
      uVar6 = (ulong)uVar5;
      plVar4 = (phVar2->super_node).next_;
      if ((plVar4 == (node_ptr)0x0) || (plVar4 == &phVar2->super_node)) break;
      local_658 = carry.data_.root_plus_size_.m_header.super_node.next_;
      local_660 = plVar4;
      boost::intrusive::
      list_impl<boost::intrusive::mhtraits<libtorrent::aux::announce_entry,_boost::intrusive::list_member_hook<>,_&libtorrent::aux::announce_entry::list_hook>,_unsigned_long,_true,_void>
      ::splice(&carry,(int)&local_658,(__off64_t *)init,(int)&local_660,in_R8,in_R9,
               in_stack_fffffffffffff988);
      plVar10 = (long *)((long)counter.rawbuf + 8);
      for (uVar7 = 0; uVar9 = uVar5, uVar6 != uVar7; uVar7 = uVar7 + 1) {
        if (((long *)*plVar10 == (long *)0x0) || (plVar10 == (long *)*plVar10)) {
          uVar6 = uVar7;
          uVar9 = (uint)uVar7;
          break;
        }
        plVar8 = (list_impl<boost::intrusive::mhtraits<libtorrent::aux::announce_entry,boost::intrusive::list_member_hook<>,&libtorrent::aux::announce_entry::list_hook>,unsigned_long,true,void>
                  *)(plVar10 + -1);
        boost::intrusive::
        list_impl<boost::intrusive::mhtraits<libtorrent::aux::announce_entry,boost::intrusive::list_member_hook<>,&libtorrent::aux::announce_entry::list_hook>,unsigned_long,true,void>
        ::
        merge<libtorrent::aux::tracker_list::replace(std::vector<libtorrent::v1_2::announce_entry,std::allocator<libtorrent::v1_2::announce_entry>>const&)::__0>
                  (plVar8,&carry);
        plVar10 = plVar10 + 3;
        boost::intrusive::
        list_impl<boost::intrusive::mhtraits<libtorrent::aux::announce_entry,_boost::intrusive::list_member_hook<>,_&libtorrent::aux::announce_entry::list_hook>,_unsigned_long,_true,_void>
        ::swap(&carry,(list_impl<boost::intrusive::mhtraits<libtorrent::aux::announce_entry,_boost::intrusive::list_member_hook<>,_&libtorrent::aux::announce_entry::list_hook>,_unsigned_long,_true,_void>
                       *)plVar8);
      }
      boost::intrusive::
      list_impl<boost::intrusive::mhtraits<libtorrent::aux::announce_entry,_boost::intrusive::list_member_hook<>,_&libtorrent::aux::announce_entry::list_hook>,_unsigned_long,_true,_void>
      ::swap(&carry,(list_impl<boost::intrusive::mhtraits<libtorrent::aux::announce_entry,_boost::intrusive::list_member_hook<>,_&libtorrent::aux::announce_entry::list_hook>,_unsigned_long,_true,_void>
                     *)((long)counter.rawbuf + uVar6 * 0x18));
      uVar5 = (uVar9 == uVar5) + uVar5;
    }
    plVar8 = (list_impl<boost::intrusive::mhtraits<libtorrent::aux::announce_entry,boost::intrusive::list_member_hook<>,&libtorrent::aux::announce_entry::list_hook>,unsigned_long,true,void>
              *)&counter;
    for (uVar7 = 1; uVar7 < uVar6; uVar7 = uVar7 + 1) {
      plVar8 = plVar8 + 0x18;
      boost::intrusive::
      list_impl<boost::intrusive::mhtraits<libtorrent::aux::announce_entry,boost::intrusive::list_member_hook<>,&libtorrent::aux::announce_entry::list_hook>,unsigned_long,true,void>
      ::
      merge<libtorrent::aux::tracker_list::replace(std::vector<libtorrent::v1_2::announce_entry,std::allocator<libtorrent::v1_2::announce_entry>>const&)::__0>
                (plVar8);
    }
    boost::intrusive::
    list_impl<boost::intrusive::mhtraits<libtorrent::aux::announce_entry,_boost::intrusive::list_member_hook<>,_&libtorrent::aux::announce_entry::list_hook>,_unsigned_long,_true,_void>
    ::swap(&init->super_type,
           (list_impl<boost::intrusive::mhtraits<libtorrent::aux::announce_entry,_boost::intrusive::list_member_hook<>,_&libtorrent::aux::announce_entry::list_hook>,_unsigned_long,_true,_void>
            *)((long)counter.rawbuf + uVar6 * 0x18 + -0x18));
    boost::intrusive::detail::
    array_initializer<boost::intrusive::list_impl<boost::intrusive::mhtraits<libtorrent::aux::announce_entry,_boost::intrusive::list_member_hook<>,_&libtorrent::aux::announce_entry::list_hook>,_unsigned_long,_true,_void>,_64UL>
    ::~array_initializer(&counter);
    boost::intrusive::
    list_impl<boost::intrusive::mhtraits<libtorrent::aux::announce_entry,_boost::intrusive::list_member_hook<>,_&libtorrent::aux::announce_entry::list_hook>,_unsigned_long,_true,_void>
    ::~list_impl(&carry);
  }
  this->m_last_working_tracker = (announce_entry *)0x0;
  return;
}

Assistant:

void tracker_list::replace(std::vector<lt::announce_entry> const& aes)
{
	INVARIANT_CHECK;

	m_trackers.clear();
	m_url_index.clear();

	m_storage.~object_pool<aux::announce_entry>();
	new (&m_storage) boost::object_pool<aux::announce_entry>();

	for (auto const& ae : aes)
	{
		if (ae.url.empty()) continue;
		aux::announce_entry* new_ae = m_storage.construct(ae);
		auto const [iter, added] = m_url_index.insert(std::make_pair(string_view(new_ae->url), new_ae));
		if (!added)
		{
			// if we already have an entry with this URL, skip it
			// but merge the source bits
			m_storage.destroy(new_ae);
			iter->second->source |= ae.source;
			continue;
		}
		m_trackers.push_back(*new_ae);
	}

	// make sure the trackers are correctly ordered by tier
	m_trackers.sort([](aux::announce_entry const& lhs, aux::announce_entry const& rhs)
	{ return lhs.tier < rhs.tier; });

	m_last_working_tracker = nullptr;
}